

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtSampleRenderCase::init
          (InterpolateAtSampleRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderTarget RVar2;
  int iVar3;
  RenderTarget *pRVar4;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  RVar2 = (this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.m_renderTarget;
  if ((RVar2 == TARGET_DEFAULT) ||
     ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
      m_numRequestedSamples != 0)) {
    if (RVar2 == TARGET_DEFAULT) {
      pRVar4 = Context::getRenderTarget
                         ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                          super_TestCase.m_context);
      if (pRVar4->m_numSamples < 2) goto LAB_004168b8;
    }
    local_190._0_8_ =
         ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Verifying that a interpolateAtSample returns different values for different samples.\n"
               ,0x55);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tRender high-frequency function, map result to black/white.\n",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t=> Resulting image should contain n+1 shades of gray, n = sample count.\n",0x49);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
LAB_004168b8:
    local_190._0_8_ =
         ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Verifying that a interpolateAtSample returns different values for different samples.\n"
               ,0x55);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tRender high-frequency function, map result to black/white.\n",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t=> Resulting image image should contain both black and white pixels.\n",0x46);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  iVar3 = MultisampleShadeCountRenderCase::init(&this->super_MultisampleShadeCountRenderCase,ctx_00)
  ;
  return iVar3;
}

Assistant:

void InterpolateAtSampleRenderCase::init (void)
{
	const bool isSingleSampleTarget = (m_renderTarget != TARGET_DEFAULT && m_numRequestedSamples == 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1);

	// test purpose and expectations
	if (isSingleSampleTarget)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that a interpolateAtSample returns different values for different samples.\n"
			<< "	Render high-frequency function, map result to black/white.\n"
			<< "	=> Resulting image image should contain both black and white pixels.\n"
			<< tcu::TestLog::EndMessage;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying that a interpolateAtSample returns different values for different samples.\n"
			<< "	Render high-frequency function, map result to black/white.\n"
			<< "	=> Resulting image should contain n+1 shades of gray, n = sample count.\n"
			<< tcu::TestLog::EndMessage;
	}

	MultisampleShadeCountRenderCase::init();
}